

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

bool __thiscall ThreadContext::IsActivePropertyId(ThreadContext *this,PropertyId pid)

{
  code *pcVar1;
  undefined4 *puVar2;
  uint uVar3;
  bool bVar4;
  
  if (pid == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x4cb,"(pid != Js::Constants::NoProperty)",
                       "pid != Js::Constants::NoProperty");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar2 = 0;
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (0xf < (uint)pid) {
      uVar3 = pid - 0x10;
      bVar4 = false;
      if ((-1 < (int)uVar3) &&
         (bVar4 = false,
         (int)uVar3 <
         (this->propertyMap->
         super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
         ).count)) {
        bVar4 = (this->propertyMap->
                super_BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
                ).entries[uVar3].
                super_DefaultHashedEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                .super_ImplicitKeyValueEntry<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*>
                .
                super_ValueEntry<const_Js::PropertyRecord_*,_JsUtil::(anonymous_namespace)::ValueEntryData<const_Js::PropertyRecord_*>_>
                .super_ValueEntryData<const_Js::PropertyRecord_*>.value != (PropertyRecord *)0x0;
      }
    }
  }
  return bVar4;
}

Assistant:

bool ThreadContext::IsActivePropertyId(Js::PropertyId pid)
{
    Assert(pid != Js::Constants::NoProperty);
    if (Js::IsInternalPropertyId(pid))
    {
        return true;
    }

    int propertyIndex = pid - Js::PropertyIds::_none;

    const Js::PropertyRecord * propertyRecord;
    if (propertyMap->TryGetValueAt(propertyIndex, &propertyRecord) && propertyRecord != nullptr)
    {
        return true;
    }

    return false;
}